

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_fixups.cpp
# Opt level: O3

error_code __thiscall
pstore::exchange::import_ns::internal_fixup::key(internal_fixup *this,string *k)

{
  int iVar1;
  uint64_t *args;
  error_code eVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)k);
  if (iVar1 == 0) {
    *(byte *)&(this->seen_).super__Base_bitset<1UL>._M_w =
         (byte)(this->seen_).super__Base_bitset<1UL>._M_w | 1;
    eVar2 = rule::
            push<pstore::exchange::import_ns::details::section_name,pstore::repo::section_kind*>
                      (&this->super_rule,&this->section_);
    return eVar2;
  }
  iVar1 = std::__cxx11::string::compare((char *)k);
  if (iVar1 == 0) {
    *(byte *)&(this->seen_).super__Base_bitset<1UL>._M_w =
         (byte)(this->seen_).super__Base_bitset<1UL>._M_w | 2;
    args = &this->type_;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)k);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)k);
      if (iVar1 != 0) {
        eVar2 = make_error_code(unrecognized_ifixup_key);
        return eVar2;
      }
      *(byte *)&(this->seen_).super__Base_bitset<1UL>._M_w =
           (byte)(this->seen_).super__Base_bitset<1UL>._M_w | 8;
      eVar2 = rule::push<pstore::exchange::import_ns::int64_rule,long*>
                        (&this->super_rule,&this->addend_);
      return eVar2;
    }
    *(byte *)&(this->seen_).super__Base_bitset<1UL>._M_w =
         (byte)(this->seen_).super__Base_bitset<1UL>._M_w | 4;
    args = &this->offset_;
  }
  eVar2 = rule::push<pstore::exchange::import_ns::uint64_rule,unsigned_long*>
                    (&this->super_rule,args);
  return eVar2;
}

Assistant:

std::error_code internal_fixup::key (std::string const & k) {
                if (k == "section") {
                    seen_[section] = true;
                    return this->push<details::section_name> (&section_);
                }
                if (k == "type") {
                    seen_[type] = true;
                    return this->push<uint64_rule> (&type_);
                }
                if (k == "offset") {
                    seen_[offset] = true;
                    return this->push<uint64_rule> (&offset_);
                }
                if (k == "addend") {
                    seen_[addend] = true;
                    return this->push<int64_rule> (&addend_);
                }
                return error::unrecognized_ifixup_key;
            }